

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O0

int undo(int f,int n)

{
  int iVar1;
  bool bVar2;
  int local_44;
  int local_40;
  int lineno;
  int save;
  int offset;
  line *lp;
  int rval;
  int done;
  undo_rec *nptr;
  undo_rec *ptr;
  int local_10;
  int n_local;
  int f_local;
  
  if (n < 0) {
    n_local = 0;
  }
  else {
    nptr = curbp->b_undoptr;
    if (((nptr == (undo_rec *)0x0) && (undo::nulled == 1)) || (rptcount == 0)) {
      nptr = (curbp->b_undo).tqh_first;
      undo::nulled = 1;
    }
    lp._0_4_ = 1;
    ptr._4_4_ = n;
    local_10 = f;
    while (bVar2 = ptr._4_4_ != 0, ptr._4_4_ = ptr._4_4_ + -1, bVar2) {
      while( true ) {
        bVar2 = false;
        if (nptr != (undo_rec *)0x0) {
          bVar2 = nptr->type == BOUNDARY;
        }
        if (!bVar2) break;
        _rval = (nptr->next).tqe_next;
        if ((nptr->next).tqe_next == (undo_rec *)0x0) {
          (curbp->b_undo).tqh_last = (nptr->next).tqe_prev;
        }
        else {
          (((nptr->next).tqe_next)->next).tqe_prev = (nptr->next).tqe_prev;
        }
        *(nptr->next).tqe_prev = (nptr->next).tqe_next;
        free_undo_record(nptr);
        nptr = _rval;
      }
      if (nptr == (undo_rec *)0x0) {
        dobeep();
        ewprintf("No further undo information");
        lp._0_4_ = 0;
        undo::nulled = 1;
        break;
      }
      undo::nulled = 0;
      undo_add_boundary(8,1);
      local_40 = boundary_flag;
      boundary_flag = 0;
      lp._4_4_ = 0;
      do {
        if ((nptr->type != BOUNDARY) && (nptr->type != MODIFIED)) {
          iVar1 = find_lo(nptr->pos,(line **)&save,&lineno,&local_44);
          if (iVar1 == 0) {
            dobeep();
            ewprintf("Internal error in Undo!");
            lp._0_4_ = 0;
            break;
          }
          curwp->w_dotp = _save;
          curwp->w_doto = lineno;
          curwp->w_markline = curwp->w_dotline;
          curwp->w_dotline = local_44;
        }
        switch(nptr->type) {
        case INSERT:
          ldelete((nptr->region).r_size,0);
          break;
        case DELETE:
          _save = curwp->w_dotp;
          lineno = curwp->w_doto;
          region_put_data(nptr->content,(nptr->region).r_size);
          curwp->w_dotp = _save;
          curwp->w_doto = lineno;
          break;
        case BOUNDARY:
          lp._4_4_ = 1;
          break;
        case MODIFIED:
          curbp->b_flag = curbp->b_flag & 0xfe;
          break;
        case DELREG:
          region_put_data(nptr->content,(nptr->region).r_size);
        }
        nptr = (nptr->next).tqe_next;
      } while (nptr != (undo_rec *)0x0 && lp._4_4_ == 0);
      boundary_flag = local_40;
      undo_add_boundary(8,1);
      ewprintf("Undo!");
    }
    curbp->b_undoptr = nptr;
    n_local = (int)lp;
  }
  return n_local;
}

Assistant:

int
undo(int f, int n)
{
	struct undo_rec	*ptr, *nptr;
	int		 done, rval;
	struct line	*lp;
	int		 offset, save;
	static int	 nulled = FALSE;
	int		 lineno;

	if (n < 0)
		return (FALSE);

	ptr = curbp->b_undoptr;

	/* first invocation, make ptr point back to the top of the list */
	if ((ptr == NULL && nulled == TRUE) ||  rptcount == 0) {
		ptr = TAILQ_FIRST(&curbp->b_undo);
		nulled = TRUE;
	}

	rval = TRUE;
	while (n--) {
		/* if we have a spurious boundary, free it and move on.... */
		while (ptr && ptr->type == BOUNDARY) {
			nptr = TAILQ_NEXT(ptr, next);
			TAILQ_REMOVE(&curbp->b_undo, ptr, next);
			free_undo_record(ptr);
			ptr = nptr;
		}
		/*
		 * Ptr is NULL, but on the next run, it will point to the
		 * top again, redoing all stuff done in the buffer since
		 * its creation.
		 */
		if (ptr == NULL) {
			dobeep();
			ewprintf("No further undo information");
			rval = FALSE;
			nulled = TRUE;
			break;
		}
		nulled = FALSE;

		/*
		 * Loop while we don't get a boundary specifying we've
		 * finished the current action...
		 */

		undo_add_boundary(FFRAND, 1);

		save = boundary_flag;
		boundary_flag = FALSE;

		done = 0;
		do {
			/*
			 * Move to where this has to apply
			 *
			 * Boundaries (and the modified flag)  are put as
			 * position 0 (to save lookup time in find_dot)
			 * so we must not move there...
			 */
			if (ptr->type != BOUNDARY && ptr->type != MODIFIED) {
				if (find_lo(ptr->pos, &lp,
				    &offset, &lineno) == FALSE) {
					dobeep();
					ewprintf("Internal error in Undo!");
					rval = FALSE;
					break;
				}
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				curwp->w_markline = curwp->w_dotline;
				curwp->w_dotline = lineno;
			}

			/*
			 * Do operation^-1
			 */
			switch (ptr->type) {
			case INSERT:
				ldelete(ptr->region.r_size, KNONE);
				break;
			case DELETE:
				lp = curwp->w_dotp;
				offset = curwp->w_doto;
				region_put_data(ptr->content,
				    ptr->region.r_size);
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				break;
			case DELREG:
				region_put_data(ptr->content,
				    ptr->region.r_size);
				break;
			case BOUNDARY:
				done = 1;
				break;
			case MODIFIED:
				curbp->b_flag &= ~BFCHG;
				break;
			default:
				break;
			}

			/* And move to next record */
			ptr = TAILQ_NEXT(ptr, next);
		} while (ptr != NULL && !done);

		boundary_flag = save;
		undo_add_boundary(FFRAND, 1);

		ewprintf("Undo!");
	}

	curbp->b_undoptr = ptr;

	return (rval);
}